

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize_constraint.cpp
# Opt level: O2

bool __thiscall Clasp::DefaultMinimize::relaxBound(DefaultMinimize *this,bool full)

{
  uint uVar1;
  long *plVar2;
  SharedMinimizeData *this_00;
  bool bVar3;
  long lVar4;
  
  plVar2 = this->bounds_;
  if (*plVar2 != 0x7fffffffffffffff) {
    uVar1 = this->size_;
    for (lVar4 = 0; (ulong)uVar1 << 3 != lVar4; lVar4 = lVar4 + 8) {
      *(undefined8 *)((long)plVar2 + lVar4) = 0x7fffffffffffffff;
    }
  }
  this_00 = (this->super_MinimizeConstraint).shared_;
  this->pos_ = (Iter)(this_00 + 1);
  this->actLev_ = 0;
  if ((!full) && (bVar3 = SharedMinimizeData::optimize(this_00), bVar3)) {
    return true;
  }
  stepInit(this,0);
  return true;
}

Assistant:

bool DefaultMinimize::relaxBound(bool full) {
	if (active()) { std::fill(opt(), opt()+size_, SharedData::maxBound()); }
	pos_       = shared_->lits;
	actLev_    = 0;
	if (full || !shared_->optimize()) { stepInit(0); }
	return true;
}